

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

void scalar_rwnaf(int8_t *out,uchar *in)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int8_t *piVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  
  uVar9 = (uint)(byte)((*in & 0x3e) + 1);
  piVar7 = out;
  for (lVar10 = -0x1fe; bVar8 = (byte)uVar9, lVar10 != 0; lVar10 = lVar10 + 5) {
    cVar1 = (bVar8 & 0x3f) - 0x20;
    *piVar7 = cVar1;
    iVar6 = (int)lVar10;
    iVar2 = scalar_get_bit(in,iVar6 + 0x204);
    iVar3 = scalar_get_bit(in,iVar6 + 0x205);
    iVar4 = scalar_get_bit(in,iVar6 + 0x206);
    iVar5 = scalar_get_bit(in,iVar6 + 0x207);
    iVar6 = scalar_get_bit(in,iVar6 + 0x208);
    uVar9 = (iVar5 * 0x10000000 + iVar4 * 0x8000000 + iVar3 * 0x4000000 + iVar2 * 0x2000000 +
             ((int)(char)bVar8 - (int)cVar1 & 0xffffffe0U) * 0x80000 >> 0x18) + iVar6 * 0x20;
    piVar7 = piVar7 + 1;
  }
  out[0x66] = bVar8;
  return;
}

Assistant:

static void scalar_rwnaf(int8_t out[103], const unsigned char in[64]) {
    int i;
    int8_t window, d;

    window = (in[0] & (DRADIX_WNAF - 1)) | 1;
    for (i = 0; i < 102; i++) {
        d = (window & (DRADIX_WNAF - 1)) - DRADIX;
        out[i] = d;
        window = (window - d) >> RADIX;
        window += scalar_get_bit(in, (i + 1) * RADIX + 1) << 1;
        window += scalar_get_bit(in, (i + 1) * RADIX + 2) << 2;
        window += scalar_get_bit(in, (i + 1) * RADIX + 3) << 3;
        window += scalar_get_bit(in, (i + 1) * RADIX + 4) << 4;
        window += scalar_get_bit(in, (i + 1) * RADIX + 5) << 5;
    }
    out[i] = window;
}